

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O2

int Fl::test_shortcut(uint shortcut)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (shortcut != 0) {
    uVar2 = fl_tolower(shortcut & 0xffff);
    iVar1 = e_state;
    uVar3 = shortcut | 0x10000;
    if (uVar2 == (shortcut & 0xffff)) {
      uVar3 = shortcut;
    }
    if ((((e_state ^ 0x7fff0000U) & uVar3) == 0) && (uVar4 = 0, ((uVar3 ^ e_state) & 0x4c0000) == 0)
       ) {
      uVar2 = uVar3 & 0xffff;
      uVar4 = 1;
      if ((((uVar3 ^ e_state) >> 0x10 & 1) != 0) || (uVar2 != e_keysym)) {
        uVar3 = fl_utf8decode(e_text,e_text + e_length,(wchar_t *)0x0);
        if ((((uint)iVar1 >> 0x11 & 1) != 0) || (uVar2 != uVar3)) {
          uVar4 = (uint)((uVar3 ^ uVar2) == 0x40 & uVar2 - 0x3f < 0x21 & (byte)((uint)iVar1 >> 0x12)
                        );
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int Fl::test_shortcut(unsigned int shortcut) {
  if (!shortcut) return 0;

  unsigned int v = shortcut & FL_KEY_MASK;
  if (((unsigned)fl_tolower(v))!=v) {
    shortcut |= FL_SHIFT;
  }

  int shift = Fl::event_state();
  // see if any required shift flags are off:
  if ((shortcut&shift) != (shortcut&0x7fff0000)) return 0;
  // record shift flags that are wrong:
  int mismatch = (shortcut^shift)&0x7fff0000;
  // these three must always be correct:
  if (mismatch&(FL_META|FL_ALT|FL_CTRL)) return 0;

  unsigned int key = shortcut & FL_KEY_MASK;

  // if shift is also correct, check for exactly equal keysyms:
  if (!(mismatch&(FL_SHIFT)) && key == (unsigned)Fl::event_key()) return 1;

  // try matching utf8, ignore shift:
  unsigned int firstChar = fl_utf8decode(Fl::event_text(), Fl::event_text()+Fl::event_length(), 0);
  if ( ! (FL_CAPS_LOCK&shift) && key==firstChar) return 1;

  // kludge so that Ctrl+'_' works (as opposed to Ctrl+'^_'):
  if ((shift&FL_CTRL) && key >= 0x3f && key <= 0x5F
      && firstChar==(key^0x40)) return 1; // firstChar should be within a-z
  return 0;
}